

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O3

void __thiscall Container::wait_for_slave(Container *this)

{
  bool bVar1;
  uint32_t interval;
  __pid_t _Var2;
  uint uVar3;
  Config *this_00;
  ContextManager *pCVar4;
  time_ms_t tVar5;
  memory_kb_t mVar6;
  TaskData *pTVar7;
  Container *pCVar8;
  int status;
  uint local_54;
  string local_50;
  
  this_00 = Config::get();
  interval = Config::get_timer_interval_ms(this_00);
  start_timer(interval);
  gettimeofday((timeval *)&this->run_start_,(__timezone_ptr_t)0x0);
  pCVar8 = (Container *)(ulong)(uint)this->slave_pid_;
  _Var2 = waitpid(this->slave_pid_,(int *)&local_54,0);
  if (_Var2 != this->slave_pid_) {
    do {
      if (timer_interrupt == false) {
        pCVar4 = ContextManager::get();
        format_abi_cxx11_(&local_50,"waitpid() failed: %m");
        (**pCVar4->_vptr_ContextManager)(pCVar4,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      timer_interrupt = false;
      pTVar7 = (this->task_data_).ptr_;
      if (pTVar7->time_limit_ms != -1) {
        pCVar8 = this;
        tVar5 = get_time_usage_ms(this);
        pTVar7 = (this->task_data_).ptr_;
        if (tVar5 <= pTVar7->time_limit_ms) goto LAB_00118837;
LAB_001188b6:
        kill_all(pCVar8);
        goto LAB_001188bb;
      }
LAB_00118837:
      if (pTVar7->wall_time_limit_ms != -1) {
        pCVar8 = this;
        tVar5 = get_wall_clock_ms(this);
        if (((this->task_data_).ptr_)->wall_time_limit_ms < tVar5) goto LAB_001188b6;
      }
      pCVar8 = (Container *)(ulong)(uint)this->slave_pid_;
      _Var2 = waitpid(this->slave_pid_,(int *)&local_54,0);
    } while (_Var2 != this->slave_pid_);
  }
  kill_all(pCVar8);
  uVar3 = local_54 & 0x7f;
  if (uVar3 == 0) {
    pTVar7 = (this->task_data_).ptr_;
    pTVar7->exited = true;
    pTVar7->exit_code = local_54 >> 8 & 0xff;
  }
  if (0x1ffffff < (int)(uVar3 * 0x1000000 + 0x1000000)) {
    pTVar7 = (this->task_data_).ptr_;
    pTVar7->signaled = true;
    pTVar7->term_signal = uVar3;
  }
LAB_001188bb:
  stop_timer();
  tVar5 = get_time_usage_ms(this);
  ((this->task_data_).ptr_)->time_usage_ms = tVar5;
  tVar5 = get_time_usage_sys_ms(this);
  ((this->task_data_).ptr_)->time_usage_sys_ms = tVar5;
  tVar5 = get_time_usage_user_ms(this);
  ((this->task_data_).ptr_)->time_usage_user_ms = tVar5;
  tVar5 = get_wall_clock_ms(this);
  ((this->task_data_).ptr_)->wall_time_usage_ms = tVar5;
  mVar6 = get_memory_usage_kb(this);
  ((this->task_data_).ptr_)->memory_usage_kb = mVar6;
  bVar1 = is_oom_killed(this);
  ((this->task_data_).ptr_)->oom_killed = bVar1;
  bVar1 = is_memory_limit_hit(this);
  pTVar7 = (this->task_data_).ptr_;
  pTVar7->memory_limit_hit = bVar1;
  if (pTVar7->time_limit_ms != -1) {
    pTVar7->time_limit_exceeded = pTVar7->time_limit_ms < pTVar7->time_usage_ms;
  }
  if (pTVar7->wall_time_limit_ms != -1) {
    pTVar7->wall_time_limit_exceeded = pTVar7->wall_time_limit_ms < pTVar7->wall_time_usage_ms;
  }
  if (pTVar7->error == true) {
    pCVar4 = ContextManager::get();
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Slave exited with error","");
    (**pCVar4->_vptr_ContextManager)(pCVar4,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void Container::wait_for_slave() {
    start_timer(Config::get().get_timer_interval_ms());
    reset_wall_clock();

    while (true) {
        int status;
        pid_t pid = waitpid(slave_pid_, &status, 0);
        if (pid != slave_pid_) {
            if (!timer_interrupt) {
                die(format("waitpid() failed: %m"));
            }

            timer_interrupt = false;

            if (task_data_->time_limit_ms != -1 && get_time_usage_ms() > task_data_->time_limit_ms) {
                kill_all();
                break;
            }

            if (task_data_->wall_time_limit_ms != -1 && get_wall_clock_ms() > task_data_->wall_time_limit_ms) {
                kill_all();
                break;
            }

            continue;
        }

        kill_all();

        if (WIFEXITED(status)) {
            task_data_->exited = true;
            task_data_->exit_code = WEXITSTATUS(status);
        }
        if (WIFSIGNALED(status)) {
            task_data_->signaled = true;
            task_data_->term_signal = WTERMSIG(status);
        }

        break;
    }

    stop_timer();

    task_data_->time_usage_ms = get_time_usage_ms();
    task_data_->time_usage_sys_ms = get_time_usage_sys_ms();
    task_data_->time_usage_user_ms = get_time_usage_user_ms();
    task_data_->wall_time_usage_ms = get_wall_clock_ms();
    task_data_->memory_usage_kb = get_memory_usage_kb();
    task_data_->oom_killed = is_oom_killed();
    task_data_->memory_limit_hit = is_memory_limit_hit();
    if (task_data_->time_limit_ms != -1) {
        task_data_->time_limit_exceeded = (task_data_->time_usage_ms > task_data_->time_limit_ms);
    }
    if (task_data_->wall_time_limit_ms != -1) {
        task_data_->wall_time_limit_exceeded = (task_data_->wall_time_usage_ms > task_data_->wall_time_limit_ms);
    }

    if (task_data_->error) {
        die("Slave exited with error");
    }
}